

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O2

void __thiscall QPlainTextEditPrivate::ensureCursorVisible(QPlainTextEditPrivate *this,bool center)

{
  QWidget *this_00;
  QScrollBar *this_01;
  bool bVar1;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  QRect QVar4;
  QRect QVar5;
  QWidgetTextControl local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  QVar4 = QWidget::rect((this->super_QAbstractScrollAreaPrivate).viewport);
  QVar5 = QPlainTextEdit::cursorRect((QPlainTextEdit *)this_00);
  if ((QVar5.y1.m_i.m_i < QVar4.y1.m_i.m_i) || (QVar4.y2.m_i.m_i < QVar5.y2.m_i.m_i)) {
    QWidgetTextControl::textCursor(local_40);
    iVar2 = QTextCursor::position();
    ensureVisible(this,iVar2,center,false);
    QTextCursor::~QTextCursor((QTextCursor *)local_40);
  }
  bVar1 = QWidget::isRightToLeft(this_00);
  if ((QVar5.x1.m_i.m_i < QVar4.x1.m_i.m_i) || (QVar4.x2.m_i.m_i < QVar5.x2.m_i.m_i)) {
    iVar2 = horizontalOffset(this);
    iVar2 = ((QVar4.x2.m_i.m_i - QVar4.x1.m_i) + 1) / -2 +
            (int)(((long)QVar5.x2.m_i.m_i + (long)QVar5.x1.m_i.m_i) / 2) + iVar2;
    this_01 = (this->super_QAbstractScrollAreaPrivate).hbar;
    if (bVar1) {
      iVar3 = QAbstractSlider::maximum(&this_01->super_QAbstractSlider);
      iVar2 = iVar3 - iVar2;
    }
    QAbstractSlider::setValue(&this_01->super_QAbstractSlider,iVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTextEditPrivate::ensureCursorVisible(bool center)
{
    Q_Q(QPlainTextEdit);
    QRect visible = viewport->rect();
    QRect cr = q->cursorRect();
    if (cr.top() < visible.top() || cr.bottom() > visible.bottom()) {
        ensureVisible(control->textCursor().position(), center);
    }

    const bool rtl = q->isRightToLeft();
    if (cr.left() < visible.left() || cr.right() > visible.right()) {
        int x = cr.center().x() + horizontalOffset() - visible.width()/2;
        hbar->setValue(rtl ? hbar->maximum() - x : x);
    }
}